

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O1

void __thiscall AddrManImpl::ResolveCollisions_(AddrManImpl *this)

{
  _Rb_tree_header *p_Var1;
  unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
  *this_00;
  bool bVar2;
  int bucket;
  uint uVar3;
  size_type sVar4;
  mapped_type *this_01;
  mapped_type *this_02;
  time_point tVar5;
  long lVar6;
  Logger *pLVar7;
  _Base_ptr p_Var8;
  NodeSeconds time;
  _Self __tmp;
  const_iterator __position;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  nid_type id_old;
  nid_type id_new;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __position._M_node =
       (this->m_tried_collisions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_tried_collisions)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    this_00 = &this->mapInfo;
    do {
      id_new = *(nid_type *)(__position._M_node + 1);
      sVar4 = std::
              _Hashtable<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count(&this_00->_M_h,&id_new);
      if (sVar4 == 1) {
        this_01 = std::__detail::
                  _Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)this_00,&id_new);
        bucket = AddrInfo::GetTriedBucket(this_01,&this->nKey,this->m_netgroupman);
        uVar3 = AddrInfo::GetBucketPosition(this_01,&this->nKey,false,bucket);
        bVar2 = CNetAddr::IsValid((CNetAddr *)this_01);
        if (!bVar2) goto LAB_00443782;
        lVar6 = *(long *)((long)this->vvTried[0] + (ulong)uVar3 * 8 + (ulong)(uint)(bucket << 9));
        if (lVar6 == -1) {
          tVar5 = NodeClock::now();
          time.__d.__r = (duration)((long)tVar5.__d.__r / 1000000000);
          goto LAB_0044377d;
        }
        id_old = lVar6;
        this_02 = std::__detail::
                  _Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)this_00,&id_old);
        tVar5 = NodeClock::now();
        time.__d.__r = (duration)((long)tVar5.__d.__r / 1000000000);
        if ((long)time.__d.__r - (this_02->m_last_success).__d.__r < 0x3840) goto LAB_00443782;
        lVar6 = (long)time.__d.__r - (this_02->m_last_try).__d.__r;
        if (lVar6 < 0x3840) {
          if (0x3c < lVar6) {
            pLVar7 = LogInstance();
            bVar2 = BCLog::Logger::WillLogCategoryLevel(pLVar7,ADDRMAN,Debug);
            if (bVar2) {
              CService::ToStringAddrPort_abi_cxx11_(&local_58,(CService *)this_02);
              CService::ToStringAddrPort_abi_cxx11_(&local_78,(CService *)this_01);
              logging_function._M_str = "ResolveCollisions_";
              logging_function._M_len = 0x12;
              source_file._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
              ;
              source_file._M_len = 0x5b;
              LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                        (logging_function,source_file,0x3b0,ADDRMAN,Debug,
                         (ConstevalFormatString<2U>)0x828f8d,&local_58,&local_78);
LAB_00443739:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1
                               );
              }
            }
LAB_0044377d:
            Good_(this,(CService *)this_01,false,time);
            goto LAB_00443782;
          }
        }
        else if (0x960 < (long)time.__d.__r - (this_01->m_last_success).__d.__r) {
          pLVar7 = LogInstance();
          bVar2 = BCLog::Logger::WillLogCategoryLevel(pLVar7,ADDRMAN,Debug);
          if (bVar2) {
            CService::ToStringAddrPort_abi_cxx11_(&local_58,(CService *)this_02);
            CService::ToStringAddrPort_abi_cxx11_(&local_78,(CService *)this_01);
            logging_function_00._M_str = "ResolveCollisions_";
            logging_function_00._M_len = 0x12;
            source_file_00._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
            ;
            source_file_00._M_len = 0x5b;
            LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                      (logging_function_00,source_file_00,0x3ba,ADDRMAN,Debug,
                       (ConstevalFormatString<2U>)0x828fb2,&local_58,&local_78);
            goto LAB_00443739;
          }
          goto LAB_0044377d;
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
      else {
LAB_00443782:
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
        erase_abi_cxx11_((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                          *)&this->m_tried_collisions,__position);
      }
      __position._M_node = p_Var8;
    } while ((_Rb_tree_header *)p_Var8 != p_Var1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void AddrManImpl::ResolveCollisions_()
{
    AssertLockHeld(cs);

    for (std::set<nid_type>::iterator it = m_tried_collisions.begin(); it != m_tried_collisions.end();) {
        nid_type id_new = *it;

        bool erase_collision = false;

        // If id_new not found in mapInfo remove it from m_tried_collisions
        if (mapInfo.count(id_new) != 1) {
            erase_collision = true;
        } else {
            AddrInfo& info_new = mapInfo[id_new];

            // Which tried bucket to move the entry to.
            int tried_bucket = info_new.GetTriedBucket(nKey, m_netgroupman);
            int tried_bucket_pos = info_new.GetBucketPosition(nKey, false, tried_bucket);
            if (!info_new.IsValid()) { // id_new may no longer map to a valid address
                erase_collision = true;
            } else if (vvTried[tried_bucket][tried_bucket_pos] != -1) { // The position in the tried bucket is not empty

                // Get the to-be-evicted address that is being tested
                nid_type id_old = vvTried[tried_bucket][tried_bucket_pos];
                AddrInfo& info_old = mapInfo[id_old];

                const auto current_time{Now<NodeSeconds>()};

                // Has successfully connected in last X hours
                if (current_time - info_old.m_last_success < ADDRMAN_REPLACEMENT) {
                    erase_collision = true;
                } else if (current_time - info_old.m_last_try < ADDRMAN_REPLACEMENT) { // attempted to connect and failed in last X hours

                    // Give address at least 60 seconds to successfully connect
                    if (current_time - info_old.m_last_try > 60s) {
                        LogDebug(BCLog::ADDRMAN, "Replacing %s with %s in tried table\n", info_old.ToStringAddrPort(), info_new.ToStringAddrPort());

                        // Replaces an existing address already in the tried table with the new address
                        Good_(info_new, false, current_time);
                        erase_collision = true;
                    }
                } else if (current_time - info_new.m_last_success > ADDRMAN_TEST_WINDOW) {
                    // If the collision hasn't resolved in some reasonable amount of time,
                    // just evict the old entry -- we must not be able to
                    // connect to it for some reason.
                    LogDebug(BCLog::ADDRMAN, "Unable to test; replacing %s with %s in tried table anyway\n", info_old.ToStringAddrPort(), info_new.ToStringAddrPort());
                    Good_(info_new, false, current_time);
                    erase_collision = true;
                }
            } else { // Collision is not actually a collision anymore
                Good_(info_new, false, Now<NodeSeconds>());
                erase_collision = true;
            }
        }

        if (erase_collision) {
            m_tried_collisions.erase(it++);
        } else {
            it++;
        }
    }
}